

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_xgetbv_x86_64(CPUX86State *env,uint32_t ecx)

{
  ulong uVar1;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  uint32_t ecx_local;
  CPUX86State *env_local;
  
  if ((env->cr[4] & 0x40000) == 0) {
    raise_exception_ra_x86_64(env,6,unaff_retaddr);
  }
  if (ecx == 0) {
    env_local = (CPUX86State *)env->xcr0;
  }
  else {
    if ((ecx != 1) || ((env->features[0x13] & 4) == 0)) {
      raise_exception_ra_x86_64(env,0xd,unaff_retaddr);
    }
    uVar1 = env->xcr0;
    uVar2 = get_xinuse(env);
    env_local = (CPUX86State *)(uVar1 & uVar2);
  }
  return (uint64_t)env_local;
}

Assistant:

uint64_t helper_xgetbv(CPUX86State *env, uint32_t ecx)
{
    /* The OS must have enabled XSAVE.  */
    if (!(env->cr[4] & CR4_OSXSAVE_MASK)) {
        raise_exception_ra(env, EXCP06_ILLOP, GETPC());
    }

    switch (ecx) {
    case 0:
        return env->xcr0;
    case 1:
        if (env->features[FEAT_XSAVE] & CPUID_XSAVE_XGETBV1) {
            return env->xcr0 & get_xinuse(env);
        }
        break;
    }
    raise_exception_ra(env, EXCP0D_GPF, GETPC());
}